

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfa.h
# Opt level: O3

void spvtools::CFA<spvtools::val::BasicBlock>::DepthFirstTraversal
               (BasicBlock *entry,get_blocks_func *successor_func,
               function<void_(const_spvtools::val::BasicBlock_*)> *preorder,
               function<void_(const_spvtools::val::BasicBlock_*)> *postorder,
               function<bool_(const_spvtools::val::BasicBlock_*)> *terminal)

{
  _Manager_type p_Var1;
  _Any_data local_d8;
  _Manager_type local_c8;
  _Invoker_type p_Stack_c0;
  _Any_data local_b8;
  _Manager_type local_a8;
  _Invoker_type p_Stack_a0;
  _Any_data local_98;
  _Manager_type local_88;
  _Invoker_type p_Stack_80;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type p_Stack_60;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  
  local_88 = (_Manager_type)0x0;
  p_Stack_80 = (_Invoker_type)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  p_Var1 = (successor_func->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)(&local_98,(_Any_data *)successor_func,__clone_functor);
    local_88 = (successor_func->super__Function_base)._M_manager;
    p_Stack_80 = successor_func->_M_invoker;
  }
  local_a8 = (_Manager_type)0x0;
  p_Stack_a0 = (_Invoker_type)0x0;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  p_Var1 = (preorder->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)(&local_b8,(_Any_data *)preorder,__clone_functor);
    local_a8 = (preorder->super__Function_base)._M_manager;
    p_Stack_a0 = preorder->_M_invoker;
  }
  local_c8 = (_Manager_type)0x0;
  p_Stack_c0 = (_Invoker_type)0x0;
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  p_Var1 = (postorder->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)(&local_d8,(_Any_data *)postorder,__clone_functor);
    local_c8 = (postorder->super__Function_base)._M_manager;
    p_Stack_c0 = postorder->_M_invoker;
  }
  local_48 = (code *)0x0;
  uStack_40 = 0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (_Manager_type)0x0;
  p_Stack_60 = (_Invoker_type)0x0;
  p_Var1 = (terminal->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)(&local_78,(_Any_data *)terminal,__clone_functor);
    local_68 = (terminal->super__Function_base)._M_manager;
    p_Stack_60 = terminal->_M_invoker;
  }
  DepthFirstTraversal(entry,(get_blocks_func *)&local_98,
                      (function<void_(const_spvtools::val::BasicBlock_*)> *)&local_b8,
                      (function<void_(const_spvtools::val::BasicBlock_*)> *)&local_d8,
                      (function<void_(const_spvtools::val::BasicBlock_*,_const_spvtools::val::BasicBlock_*)>
                       *)&local_58,(function<bool_(const_spvtools::val::BasicBlock_*)> *)&local_78);
  if (local_68 != (_Manager_type)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_c8 != (_Manager_type)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if (local_a8 != (_Manager_type)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if (local_88 != (_Manager_type)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  return;
}

Assistant:

void CFA<BB>::DepthFirstTraversal(const BB* entry,
                                  get_blocks_func successor_func,
                                  std::function<void(cbb_ptr)> preorder,
                                  std::function<void(cbb_ptr)> postorder,
                                  std::function<bool(cbb_ptr)> terminal) {
  DepthFirstTraversal(entry, successor_func, preorder, postorder,
                      /* backedge = */ {}, terminal);
}